

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimc.c
# Opt level: O1

int fminsearch(custom_function *funcpt,int N,double *xi,double *xf)

{
  int iVar1;
  double *dx;
  ulong uVar2;
  double eps;
  int local_34 [2];
  int niter;
  
  dx = (double *)malloc((long)N * 8);
  local_34[0] = 0;
  eps = macheps();
  if (0 < N) {
    uVar2 = 0;
    do {
      dx[uVar2] = 1.0;
      uVar2 = uVar2 + 1;
    } while ((uint)N != uVar2);
  }
  iVar1 = nel_min(funcpt,xi,N,dx,1.0,N * 200,local_34,eps,xf);
  free(dx);
  return iVar1;
}

Assistant:

int fminsearch(custom_function *funcpt,int N,double *xi,double *xf) {
	int i,retval,MAXITER,niter;
	double fsval,eps;
	double *dx;

	dx = (double*) malloc(sizeof(double) * N);

	fsval = 1.0;
	MAXITER = 200*N;
	niter = 0;
	eps = macheps(); // Use macheps program

	for(i = 0; i < N;++i) {
		dx[i] = 1.0;
	}

	retval = nel_min(funcpt,xi,N,dx,fsval,MAXITER,&niter,eps,xf);

	//printf("Iterations %d \n", niter);

	free(dx);
	return retval;
}